

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_31::bug1(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  iterator __first;
  repl_data local_2b0 [8];
  repl_data rd;
  undefined1 local_258 [8];
  environment_map env;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> empty;
  uint64_t alpha_conversion_index;
  Program prog;
  undefined1 local_1c0 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  allocator<char> local_191;
  string local_190 [8];
  string script;
  compiler_options ops;
  undefined1 local_148 [8];
  context ctxt;
  
  skiwi::create_context((ulong)local_148,0x400,0x400,0x400);
  skiwi::compiler_options::compiler_options((compiler_options *)(script.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"(let ([x 5]) (x))",&local_191);
  std::allocator<char>::~allocator(&local_191);
  skiwi::tokenize((string *)local_1c0);
  __first = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                      ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_1c0);
  prog._88_8_ = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_1c0);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            ((__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )__first._M_current,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )prog._88_8_);
  skiwi::make_program((vector *)&alpha_conversion_index);
  skiwi::define_conversion((Program *)&alpha_conversion_index);
  skiwi::single_begin_conversion((Program *)&alpha_conversion_index);
  skiwi::simplify_to_core_forms((Program *)&alpha_conversion_index);
  empty.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = &env.
          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)this);
  skiwi::alpha_conversion
            ((Program *)&alpha_conversion_index,
             (ulong *)&empty.
                       super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,(shared_ptr *)this,true);
  skiwi::cps_conversion
            ((Program *)&alpha_conversion_index,
             (compiler_options *)(script.field_2._M_local_buf + 8));
  std::make_shared<skiwi::environment<skiwi::environment_entry>,decltype(nullptr)>
            ((void **)local_258);
  skiwi::repl_data::repl_data(local_2b0);
  skiwi::global_define_environment_allocation
            ((Program *)&alpha_conversion_index,(shared_ptr *)local_258,local_2b0,
             (context *)local_148);
  skiwi::free_variable_analysis((Program *)&alpha_conversion_index,(shared_ptr *)local_258);
  skiwi::assignable_variable_conversion
            ((Program *)&alpha_conversion_index,
             (compiler_options *)(script.field_2._M_local_buf + 8));
  skiwi::closure_conversion
            ((Program *)&alpha_conversion_index,
             (compiler_options *)(script.field_2._M_local_buf + 8));
  skiwi::tail_call_analysis((Program *)&alpha_conversion_index);
  bVar1 = skiwi::only_tail_calls((Program *)&alpha_conversion_index);
  TestEq<bool,bool>(true,(bool)(bVar1 & 1),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
                    ,0x239,"void skiwi::(anonymous namespace)::bug1()");
  skiwi::destroy_context((context *)local_148);
  repl_data::~repl_data(local_2b0);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_258);
  std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::~shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)
             &env.
              super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Program::~Program((Program *)&alpha_conversion_index);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_1c0);
  std::__cxx11::string::~string(local_190);
  return;
}

Assistant:

void bug1()
    {
    context ctxt = create_context(1024, 1024, 1024, 1024);
    compiler_options ops;
    ops.parallel = false;
    //environment_map empty_env = std::make_shared<environment<environment_entry>>(nullptr);
    std::string script = "(let ([x 5]) (x))";
    auto tokens = tokenize(script);
    std::reverse(tokens.begin(), tokens.end());
    auto prog = make_program(tokens);
    define_conversion(prog);
    single_begin_conversion(prog);
    simplify_to_core_forms(prog);
    uint64_t alpha_conversion_index = 0;
    std::shared_ptr < environment<alpha_conversion_data>> empty;
    alpha_conversion(prog, alpha_conversion_index, empty);
    cps_conversion(prog, ops);
    environment_map env = std::make_shared<environment<environment_entry>>(nullptr);
    repl_data rd;
    global_define_environment_allocation(prog, env, rd, ctxt);
    free_variable_analysis(prog, env);
    assignable_variable_conversion(prog, ops);
    closure_conversion(prog, ops);
    tail_call_analysis(prog);
    TEST_ASSERT(only_tail_calls(prog));
    destroy_context(ctxt);
    }